

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O0

void __thiscall
burst::
buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
::buffered_chunk_iterator
          (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
           *this,__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last,
          int chunk_size)

{
  void *pvVar1;
  element_type *peVar2;
  int chunk_size_local;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  *this_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  (this->m_current)._M_current = first._M_current;
  (this->m_end)._M_current = last._M_current;
  this->m_chunk_size = (long)chunk_size;
  pvVar1 = operator_new__(this->m_chunk_size);
  std::shared_ptr<char>::shared_ptr<char,std::default_delete<char[]>,void>(&this->m_chunk,pvVar1);
  peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  this->m_chunk_end = peVar2;
  if (0 < this->m_chunk_size) {
    increment(this);
    return;
  }
  __assert_fail("m_chunk_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x4f,
                "burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>, int>::buffered_chunk_iterator(Iterator, Iterator, Integral) [Iterator = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, Integral = int]"
               );
}

Assistant:

buffered_chunk_iterator (Iterator first, Iterator last, Integral chunk_size):
            m_current(first),
            m_end(last),
            m_chunk_size(static_cast<difference_type>(chunk_size)),
            m_chunk
            (
                std::shared_ptr<buffer_value_type>
                (
                    new buffer_value_type[static_cast<std::size_t>(m_chunk_size)],
                    std::default_delete<buffer_value_type[]>{}
                )
            ),
            m_chunk_end(m_chunk.get())
        {
            assert(m_chunk_size > 0);
            increment();
        }